

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

qsizetype QtPrivate::indexOf<QKeySequence,QKeySequence>
                    (QList<QKeySequence> *vector,QKeySequence *u,qsizetype from)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  qsizetype qVar6;
  QKeySequence *this;
  long lVar7;
  
  uVar1 = (vector->d).size;
  uVar4 = from;
  if (from < 0) {
    uVar4 = from + uVar1;
    if ((long)(from + uVar1) < 1) {
      uVar4 = 0;
    }
  }
  qVar6 = -1;
  if (uVar4 < uVar1) {
    this = (vector->d).ptr + uVar4;
    lVar7 = uVar1 * 8 + uVar4 * -8;
    lVar2 = 8 - (long)this;
    do {
      lVar5 = lVar2;
      if (lVar7 == 0) {
        return -1;
      }
      bVar3 = QKeySequence::operator==(this,u);
      this = this + 1;
      lVar7 = lVar7 + -8;
      lVar2 = lVar5 + -8;
    } while (!bVar3);
    qVar6 = -((long)&(vector->d).ptr[-1].d + lVar5) >> 3;
  }
  return qVar6;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}